

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O3

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::parse
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,int argc,char **argv)

{
  bool bVar1;
  C *pCVar2;
  ulong uVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_50;
  
  if (0 < argc) {
    uVar3 = 0;
    do {
      (this->super_CmdLineParserRoot).m_argIdx = (int)uVar3;
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(&local_50,argv[uVar3]);
      bVar1 = processArg(this,&local_50);
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
      if (!bVar1) {
        return false;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  if ((this->super_CmdLineParserRoot).m_valueSwitchKind == 0) {
    bVar1 = true;
  }
  else {
    if ((this->super_CmdLineParserRoot).m_valueSwitchName.
        super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0) {
      pCVar2 = &StringDetailsImpl<char>::getEmptyString()::emptyString;
    }
    else {
      pCVar2 = (this->super_CmdLineParserRoot).m_valueSwitchName.
               super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
    }
    bVar1 = false;
    err::setFormatStringError("missing value for switch \'%s\'",pCVar2);
  }
  return bVar1;
}

Assistant:

bool
	parse(
		int argc,
		const char* const* argv
	) {
		bool result;

		for (int i = 0; i < argc; i++) {
			m_argIdx = i;
			result = processArg(argv[i]);
			if (!result)
				return false;
		}

		return
			checkMissingValue() &&
			static_cast<T*>(this)->finalize();
	}